

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QGlyphRun>::emplace<QGlyphRun_const&>
          (QMovableArrayOps<QGlyphRun> *this,qsizetype i,QGlyphRun *args)

{
  QGlyphRun **ppQVar1;
  qsizetype *pqVar2;
  long lVar3;
  Data *pDVar4;
  qsizetype qVar5;
  long in_FS_OFFSET;
  bool bVar6;
  Inserter IStack_58;
  QGlyphRun tmp;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QGenericArrayOps<QGlyphRun>).super_QArrayDataPointer<QGlyphRun>.d;
  if ((pDVar4 != (Data *)0x0) &&
     ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if ((this->super_QGenericArrayOps<QGlyphRun>).super_QArrayDataPointer<QGlyphRun>.size == i) {
      qVar5 = QArrayDataPointer<QGlyphRun>::freeSpaceAtEnd((QArrayDataPointer<QGlyphRun> *)this);
      if (qVar5 == 0) goto LAB_004a9204;
      QGlyphRun::QGlyphRun
                ((this->super_QGenericArrayOps<QGlyphRun>).super_QArrayDataPointer<QGlyphRun>.ptr +
                 (this->super_QGenericArrayOps<QGlyphRun>).super_QArrayDataPointer<QGlyphRun>.size,
                 args);
LAB_004a92e9:
      pqVar2 = &(this->super_QGenericArrayOps<QGlyphRun>).super_QArrayDataPointer<QGlyphRun>.size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_004a92a8;
    }
LAB_004a9204:
    if (i == 0) {
      qVar5 = QArrayDataPointer<QGlyphRun>::freeSpaceAtBegin((QArrayDataPointer<QGlyphRun> *)this);
      if (qVar5 != 0) {
        QGlyphRun::QGlyphRun
                  ((this->super_QGenericArrayOps<QGlyphRun>).super_QArrayDataPointer<QGlyphRun>.ptr
                   + -1,args);
        ppQVar1 = &(this->super_QGenericArrayOps<QGlyphRun>).super_QArrayDataPointer<QGlyphRun>.ptr;
        *ppQVar1 = *ppQVar1 + -1;
        goto LAB_004a92e9;
      }
    }
  }
  tmp.d.d.ptr = (QExplicitlySharedDataPointer<QGlyphRunPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QGlyphRun::QGlyphRun(&tmp,args);
  bVar6 = (this->super_QGenericArrayOps<QGlyphRun>).super_QArrayDataPointer<QGlyphRun>.size != 0;
  QArrayDataPointer<QGlyphRun>::detachAndGrow
            ((QArrayDataPointer<QGlyphRun> *)this,(uint)(i == 0 && bVar6),1,(QGlyphRun **)0x0,
             (QArrayDataPointer<QGlyphRun> *)0x0);
  if (i == 0 && bVar6) {
    QGlyphRun::QGlyphRun
              ((this->super_QGenericArrayOps<QGlyphRun>).super_QArrayDataPointer<QGlyphRun>.ptr + -1
               ,&tmp);
    ppQVar1 = &(this->super_QGenericArrayOps<QGlyphRun>).super_QArrayDataPointer<QGlyphRun>.ptr;
    *ppQVar1 = *ppQVar1 + -1;
    pqVar2 = &(this->super_QGenericArrayOps<QGlyphRun>).super_QArrayDataPointer<QGlyphRun>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    Inserter::Inserter(&IStack_58,(QArrayDataPointer<QGlyphRun> *)this,i,1);
    QGlyphRun::QGlyphRun(IStack_58.displaceFrom,&tmp);
    IStack_58.displaceFrom = IStack_58.displaceFrom + 1;
    Inserter::~Inserter(&IStack_58);
  }
  QGlyphRun::~QGlyphRun(&tmp);
LAB_004a92a8:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }